

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeInternalForces
          (ChElementHexaCorot_20 *this,ChVectorDynamic<> *Fi)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  element_type *peVar9;
  ChVectorDynamic<> *pCVar10;
  int iVar11;
  Index index_1;
  Index size_1;
  char *pcVar12;
  Index size;
  ActualDstType actualDst;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  Index row_1;
  Index row;
  pointer psVar17;
  double *pdVar18;
  long lVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChVectorDynamic<> displ;
  ChVectorDynamic<> FiK_local;
  ChMatrixDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  undefined1 local_c8 [40];
  double *local_a0;
  undefined1 *puStack_98;
  Index local_90;
  ChVectorDynamic<> *local_88;
  ChMatrixDynamic<> *local_80;
  long local_78;
  double *local_70;
  ulong local_68;
  long local_60;
  ChMatrixRef local_58;
  
  lVar19 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar11 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  if (lVar19 != iVar11) {
    __assert_fail("Fi.size() == GetNdofs()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaCorot_20.cpp"
                  ,0x246,
                  "virtual void chrono::fea::ChElementHexaCorot_20::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  iVar11 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_e8,(long)iVar11);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xb])(this,&local_e8);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_e8.m_storage.m_rows) {
    pcVar12 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_006d6048:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar12);
  }
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_d8,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar14 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_d8.m_storage.m_rows != uVar14) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,uVar14,1);
  }
  if (-1 < local_d8.m_storage.m_rows) {
    if (local_d8.m_storage.m_rows != 0) {
      memset(local_d8.m_storage.m_data,0,local_d8.m_storage.m_rows << 3);
    }
    local_c8._0_8_ = (PointerType)0x3ff0000000000000;
    local_80 = &this->StiffnessMatrix;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_d8,&this->StiffnessMatrix,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_e8,(Scalar *)local_c8);
    pdVar16 = local_e8.m_storage.m_data;
    local_78 = local_e8.m_storage.m_rows - 3;
    psVar17 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = 0;
    pdVar18 = local_e8.m_storage.m_data;
    local_88 = Fi;
    do {
      peVar8 = (psVar17->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)&peVar8->field_0x38;
      dVar1 = *(double *)&peVar8->field_0x40;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
      auVar2 = vfmadd231sd_fma(auVar26,auVar22,auVar2);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)&peVar8->field_0x48;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar3 = vfmadd231sd_fma(auVar28,auVar22,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar3 = vfmadd231sd_fma(auVar3,auVar27,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
      auVar4 = vfmadd231sd_fma(auVar24,auVar22,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar4 = vfmadd231sd_fma(auVar4,auVar27,auVar7);
      local_c8._0_8_ = auVar2._0_8_;
      local_c8._8_8_ = auVar3._0_8_;
      local_c8._16_8_ = auVar4._0_8_;
      if (local_78 < lVar19) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar13 = 3;
      if ((((ulong)pdVar16 & 7) == 0) &&
         (uVar13 = -((uint)((ulong)pdVar18 >> 3) & 0x1fffffff) & 7, 2 < uVar13)) {
        uVar13 = 3;
      }
      if (uVar13 != 0) {
        memcpy(pdVar16 + lVar19,local_c8,(ulong)(uVar13 * 8));
      }
      if (uVar13 < 3) {
        uVar14 = (ulong)(uVar13 << 3);
        memcpy((void *)((long)pdVar16 + lVar19 * 8 + uVar14),local_c8 + uVar14,0x18 - uVar14);
      }
      pCVar10 = local_88;
      lVar19 = lVar19 + 3;
      pdVar18 = pdVar18 + 3;
      psVar17 = psVar17 + 1;
    } while (lVar19 != 0x3c);
    uVar14 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
    uVar15 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    if ((long)(uVar15 | uVar14) < 0) {
      pcVar12 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_006d6026;
    }
    local_c8._24_8_ =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_c8._32_8_ = local_80;
    local_c8._8_8_ = uVar14;
    local_c8._16_8_ = uVar15;
    if (uVar15 != local_e8.m_storage.m_rows) {
      pcVar12 = 
      "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      puStack_98 = (undefined1 *)&local_e8;
      goto LAB_006d6048;
    }
    puStack_98 = (undefined1 *)&local_e8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_70,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_c8);
    if (-1 < local_e8.m_storage.m_rows) {
      peVar9 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      dVar1 = ((this->Volume * (peVar9->super_ChContinuumMaterial).density) / 20.0) *
              peVar9->damping_M;
      uVar14 = local_e8.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < local_e8.m_storage.m_rows) {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar1;
        auVar20 = vbroadcastsd_avx512f(auVar23);
        uVar15 = 0;
        do {
          auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])
                                            (local_e8.m_storage.m_data + uVar15));
          *(undefined1 (*) [64])(local_e8.m_storage.m_data + uVar15) = auVar21;
          uVar15 = uVar15 + 8;
        } while (uVar15 < uVar14);
      }
      if ((long)uVar14 < local_e8.m_storage.m_rows) {
        do {
          local_e8.m_storage.m_data[uVar14] = dVar1 * local_e8.m_storage.m_data[uVar14];
          uVar14 = uVar14 + 1;
        } while (local_e8.m_storage.m_rows != uVar14);
      }
      if ((local_68 != local_e8.m_storage.m_rows) || (local_60 != 1)) {
        pcVar12 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
LAB_006d607e:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar12);
      }
      if (0 < (long)local_68) {
        uVar14 = 0;
        pdVar16 = local_70;
        do {
          *pdVar16 = local_e8.m_storage.m_data[uVar14] + *pdVar16;
          uVar14 = uVar14 + 1;
          pdVar16 = pdVar16 + 1;
        } while (local_68 != uVar14);
      }
      if (local_d8.m_storage.m_rows != local_68) {
        pcVar12 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
        goto LAB_006d607e;
      }
      if (0 < local_d8.m_storage.m_rows) {
        uVar14 = 0;
        pdVar16 = local_70;
        do {
          local_d8.m_storage.m_data[uVar14] = *pdVar16 + local_d8.m_storage.m_data[uVar14];
          uVar14 = uVar14 + 1;
          pdVar16 = pdVar16 + 1;
        } while (local_d8.m_storage.m_rows != uVar14);
      }
      if (-1 < local_d8.m_storage.m_rows) {
        uVar14 = local_d8.m_storage.m_rows & 0x7ffffffffffffff8;
        if (7 < local_d8.m_storage.m_rows) {
          uVar15 = 0;
          auVar20 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          do {
            auVar21 = vxorpd_avx512dq(auVar20,*(undefined1 (*) [64])
                                               (local_d8.m_storage.m_data + uVar15));
            *(undefined1 (*) [64])(local_d8.m_storage.m_data + uVar15) = auVar21;
            uVar15 = uVar15 + 8;
          } while (uVar15 < uVar14);
        }
        if ((long)uVar14 < local_d8.m_storage.m_rows) {
          do {
            auVar25._0_8_ = -local_d8.m_storage.m_data[uVar14];
            auVar25._8_8_ = 0x8000000000000000;
            dVar1 = (double)vmovlpd_avx(auVar25);
            local_d8.m_storage.m_data[uVar14] = dVar1;
            uVar14 = uVar14 + 1;
          } while (local_d8.m_storage.m_rows != uVar14);
        }
        local_a0 = (double *)0x0;
        puStack_98 = (undefined1 *)0x0;
        local_90 = 0;
        local_c8._0_8_ = local_d8.m_storage.m_data;
        local_c8._8_8_ = local_d8.m_storage.m_rows;
        local_c8._16_8_ = 1;
        local_c8._24_8_ = 1;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (pCVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value =
             (pCVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value < 0 &&
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_c8,&(this->super_ChElementCorotational).A,0x14,&local_58)
        ;
        if (local_a0 != (double *)0x0) {
          free((void *)local_a0[-1]);
        }
        if (local_70 != (double *)0x0) {
          free((void *)local_70[-1]);
        }
        if (local_d8.m_storage.m_data != (double *)0x0) {
          free((void *)local_d8.m_storage.m_data[-1]);
        }
        if (local_e8.m_storage.m_data != (double *)0x0) {
          free((void *)local_e8.m_storage.m_data[-1]);
        }
        return;
      }
    }
  }
  pcVar12 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006d6026:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar12);
}

Assistant:

void ChElementHexaCorot_20::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    for (int in = 0; in < 20; ++in) {
        displ.segment(in * 3, 3) = (A.transpose() * nodes[in]->pos_dt).eigen();  // nodal speeds, local
    }
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->Volume * Material->Get_density()) / 20.0;
    displ *= (lumped_node_mass * Material->Get_RayleighDampingM());  // reuse 'displ' for performance
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 20, Fi);
}